

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O3

void __thiscall capnp::compiler::BrandedDecl::BrandedDecl(BrandedDecl *this,BrandedDecl *other)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  BrandScope *pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  CapTableReader *pCVar10;
  void *pvVar11;
  WirePointer *pWVar12;
  StructDataBitCount SVar13;
  StructPointerCount SVar14;
  undefined2 uVar15;
  int iVar16;
  undefined4 uVar17;
  Refcounted *refcounted;
  uint uVar18;
  
  uVar3 = (other->body).tag;
  (this->body).tag = uVar3;
  uVar18 = uVar3;
  if (uVar3 == 1) {
    *(undefined8 *)((long)&(this->body).field_1 + 0x20) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x20);
    uVar5 = *(undefined8 *)&(other->body).field_1;
    uVar6 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    uVar7 = *(undefined8 *)((long)&(other->body).field_1 + 0x18);
    *(undefined8 *)((long)&(this->body).field_1 + 0x10) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x10);
    *(undefined8 *)((long)&(this->body).field_1 + 0x18) = uVar7;
    *(undefined8 *)&(this->body).field_1 = uVar5;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar6;
    bVar2 = (other->body).field_1.space[0x28];
    (this->body).field_1.space[0x28] = bVar2;
    if (bVar2 == '\x01') {
      uVar5 = *(undefined8 *)((long)&(other->body).field_1 + 0x30);
      uVar6 = *(undefined8 *)((long)&(other->body).field_1 + 0x38);
      uVar7 = *(undefined8 *)((long)&(other->body).field_1 + 0x40);
      uVar8 = *(undefined8 *)((long)&(other->body).field_1 + 0x48);
      uVar9 = *(undefined8 *)((long)&(other->body).field_1 + 0x58);
      *(undefined8 *)((long)&(this->body).field_1 + 0x50) =
           *(undefined8 *)((long)&(other->body).field_1 + 0x50);
      *(undefined8 *)((long)&(this->body).field_1 + 0x58) = uVar9;
      *(undefined8 *)((long)&(this->body).field_1 + 0x40) = uVar7;
      *(undefined8 *)((long)&(this->body).field_1 + 0x48) = uVar8;
      *(undefined8 *)((long)&(this->body).field_1 + 0x30) = uVar5;
      *(undefined8 *)((long)&(this->body).field_1 + 0x38) = uVar6;
    }
    uVar18 = (other->body).tag;
  }
  if (uVar18 == 2) {
    uVar5 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    *(undefined8 *)&(this->body).field_1 = *(undefined8 *)&(other->body).field_1;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar5;
  }
  (this->brand).disposer = (Disposer *)0x0;
  (this->brand).ptr = (BrandScope *)0x0;
  pCVar10 = (other->source)._reader.capTable;
  pvVar11 = (other->source)._reader.data;
  pWVar12 = (other->source)._reader.pointers;
  SVar13 = (other->source)._reader.dataSize;
  SVar14 = (other->source)._reader.pointerCount;
  uVar15 = *(undefined2 *)&(other->source)._reader.field_0x26;
  iVar16 = (other->source)._reader.nestingLimit;
  uVar17 = *(undefined4 *)&(other->source)._reader.field_0x2c;
  (this->source)._reader.segment = (other->source)._reader.segment;
  (this->source)._reader.capTable = pCVar10;
  (this->source)._reader.data = pvVar11;
  (this->source)._reader.pointers = pWVar12;
  (this->source)._reader.dataSize = SVar13;
  (this->source)._reader.pointerCount = SVar14;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar15;
  (this->source)._reader.nestingLimit = iVar16;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar17;
  if (uVar3 == 1) {
    pBVar4 = (other->brand).ptr;
    puVar1 = &(pBVar4->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    (this->brand).disposer = (Disposer *)pBVar4;
    (this->brand).ptr = pBVar4;
  }
  return;
}

Assistant:

void copyFrom(OneOf& other) {
    // Initialize as a copy of `other`.  Expects that `this` starts out uninitialized, so the tag
    // is invalid.
    tag = other.tag;
    doAll(copyVariantFrom<Variants>(other)...);
  }